

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUuid.cxx
# Opt level: O2

string * __thiscall
cmUuid::BinaryToString_abi_cxx11_(string *__return_storage_ptr__,cmUuid *this,uchar *input)

{
  int iVar1;
  pointer piVar2;
  long lVar3;
  long lVar4;
  string *this_00;
  ulong uVar5;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  lVar3 = 0;
  this_00 = (string *)this;
  for (uVar5 = 0;
      piVar2 = (this->Groups).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(this->Groups).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar2 >> 2);
      uVar5 = uVar5 + 1) {
    if (uVar5 != 0) {
      this_00 = (string *)0x2d;
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      piVar2 = (this->Groups).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    iVar1 = piVar2[uVar5];
    for (lVar4 = 0; iVar1 != lVar4; lVar4 = lVar4 + 1) {
      ByteToHex_abi_cxx11_(&local_50,(cmUuid *)this_00,input[lVar4 + lVar3]);
      this_00 = &local_50;
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_50);
    }
    lVar3 = lVar3 + iVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmUuid::BinaryToString(const unsigned char* input) const
{
  std::string output;

  size_t inputIndex = 0;
  for (size_t i = 0; i < this->Groups.size(); ++i) {
    if (i != 0) {
      output += '-';
    }

    size_t bytes = this->Groups[i];
    for (size_t j = 0; j < bytes; ++j) {
      unsigned char byte = input[inputIndex++];
      output += this->ByteToHex(byte);
    }
  }

  return output;
}